

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flate.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  exception *e;
  char *filename;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    this = std::operator<<((ostream *)&std::cerr,"Usage: pipeline filename");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  run(argv[1]);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        std::cerr << "Usage: pipeline filename" << std::endl;
        exit(2);
    }
    char* filename = argv[1];

    try {
        run(filename);
    } catch (std::exception& e) {
        std::cout << e.what() << std::endl;
    }
    return 0;
}